

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O3

void __thiscall GYMPlayer::GYMPlayer(GYMPlayer *this)

{
  _Rb_tree_header *p_Var1;
  pointer *pppcVar2;
  iterator __position;
  UINT8 UVar3;
  char *local_38;
  
  PlayerBase::PlayerBase(&this->super_PlayerBase);
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__GYMPlayer_00197cf8;
  (this->_decFData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_decFData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_decFData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_devCfgs).super__Vector_base<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devCfgs).super__Vector_base<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devCfgs).super__Vector_base<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_tickFreq = 0x3c;
  p_Var1 = &(this->_tagData)._M_t._M_impl.super__Rb_tree_header;
  (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->_playState = '\0';
  this->_psTrigger = '\0';
  (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_pcmBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_pcmBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_pcmBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_devices).
  super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devices).
  super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devices).
  super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_devNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_curLoop = 0;
  this->_filePos = 0;
  this->_fileTick = 0;
  this->_playTick = 0;
  this->_playSmpl = 0;
  (this->_logger).func = PlayerLogCB;
  (this->_logger).source = this;
  (this->_logger).param = (void *)0x0;
  (this->_playOpts).genOpts.pbSpeed = 0x10000;
  this->_lastTsMult = 0;
  this->_lastTsDiv = 0;
  PlayerBase::InitDeviceOptions(this->_devOpts);
  PlayerBase::InitDeviceOptions(this->_devOpts + 1);
  GenerateDeviceConfig(this);
  UVar3 = CPConv_Init(&this->_cpc1252,"CP1252","UTF-8");
  if (UVar3 != '\0') {
    this->_cpc1252 = (CPCONV *)0x0;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(&this->_tagList,0x10);
  local_38 = (char *)0x0;
  __position._M_current =
       (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->_tagList,__position,
               &local_38);
  }
  else {
    *__position._M_current = (char *)0x0;
    pppcVar2 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar2 = *pppcVar2 + 1;
  }
  return;
}

Assistant:

GYMPlayer::GYMPlayer() :
	_tickFreq(60),
	_filePos(0),
	_fileTick(0),
	_playTick(0),
	_playSmpl(0),
	_curLoop(0),
	_playState(0x00),
	_psTrigger(0x00)
{
	size_t curDev;
	UINT8 retVal;
	
	dev_logger_set(&_logger, this, GYMPlayer::PlayerLogCB, NULL);

	_playOpts.genOpts.pbSpeed = 0x10000;

	_lastTsMult = 0;
	_lastTsDiv = 0;
	
	for (curDev = 0; curDev < 2; curDev ++)
		InitDeviceOptions(_devOpts[curDev]);
	GenerateDeviceConfig();
	
	retVal = CPConv_Init(&_cpc1252, "CP1252", "UTF-8");
	if (retVal)
		_cpc1252 = NULL;
	_tagList.reserve(16);
	_tagList.push_back(NULL);
}